

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.cpp
# Opt level: O0

void __thiscall jessilib::impl::timer_manager::~timer_manager(timer_manager *this)

{
  timer_manager *this_local;
  
  std::atomic<bool>::operator=(&this->m_thread_active,false);
  std::condition_variable::notify_one();
  std::thread::join();
  thread_pool::join(&this->m_pool);
  std::__cxx11::
  list<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
  ::clear(&this->m_detached_timers);
  std::thread::~thread(&this->m_thread);
  std::condition_variable::~condition_variable(&this->m_cvar);
  std::
  multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
  ::~multiset(&this->m_active_timers);
  std::__cxx11::
  list<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
  ::~list(&this->m_detached_timers);
  thread_pool::~thread_pool(&this->m_pool);
  return;
}

Assistant:

timer_manager::~timer_manager() {
	m_thread_active = false;
	m_cvar.notify_one();
	m_thread.join();
	m_pool.join();
	m_detached_timers.clear();
}